

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void __thiscall
CPU::WDC65816::ProcessorStorageConstructor::set_exception_generator
          (ProcessorStorageConstructor *this,Generator generator,Generator reset_generator)

{
  uint16_t uVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>
  local_30;
  iterator reset_tail_entry;
  iterator map_entry;
  Generator reset_generator_local;
  Generator generator_local;
  ProcessorStorageConstructor *this_local;
  
  reset_tail_entry = install(this,generator,Read);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>
           ::operator->(&reset_tail_entry);
  uVar1 = (uint16_t)(ppVar2->second).first;
  this->storage_->instructions[0x100].program_offsets[1] = uVar1;
  this->storage_->instructions[0x100].program_offsets[0] = uVar1;
  this->storage_->instructions[0x100].operation = JMPind;
  local_30._M_node = (_Base_ptr)install(this,reset_generator,Read);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>
           ::operator->(&local_30);
  uVar1 = (uint16_t)(ppVar2->second).first;
  this->storage_->instructions[0x101].program_offsets[1] = uVar1;
  this->storage_->instructions[0x101].program_offsets[0] = uVar1;
  this->storage_->instructions[0x101].operation = JMPind;
  return;
}

Assistant:

void set_exception_generator(Generator generator, Generator reset_generator) {
		const auto map_entry = install(generator);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].program_offsets[0] =
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].program_offsets[1] = uint16_t(map_entry->second.first);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Exception)].operation = JMPind;

		const auto reset_tail_entry = install(reset_generator);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].program_offsets[0] =
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].program_offsets[1] = uint16_t(reset_tail_entry->second.first);
		storage_.instructions[size_t(ProcessorStorage::OperationSlot::Reset)].operation = JMPind;
	}